

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O0

void __thiscall
websocketpp::connection<websocketpp::config::asio>::log_close_result
          (connection<websocketpp::config::asio> *this)

{
  ostream *poVar1;
  ostream *poVar2;
  ulong uVar3;
  element_type *this_00;
  size_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  stringstream s;
  string local_210 [38];
  byte local_1ea;
  allocator local_1e9;
  string local_1e8 [38];
  byte local_1c2;
  allocator local_1c1;
  string local_1c0 [48];
  stringstream local_190 [16];
  ostream local_180 [384];
  
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = std::operator<<(local_180,"Disconnect ");
  poVar2 = std::operator<<(poVar1,"close local:[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)&in_RDI[0x276].field_2);
  uVar3 = std::__cxx11::string::empty();
  local_1c2 = 0;
  if ((uVar3 & 1) == 0) {
    std::operator+((char *)poVar1,in_RDI);
  }
  else {
    std::allocator<char>::allocator();
    local_1c2 = 1;
    std::__cxx11::string::string(local_1c0,"",&local_1c1);
  }
  poVar2 = std::operator<<(poVar2,local_1c0);
  poVar2 = std::operator<<(poVar2,"] remote:[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)((long)&in_RDI[0x277].field_2 + 8))
  ;
  uVar3 = std::__cxx11::string::empty();
  local_1ea = 0;
  if ((uVar3 & 1) == 0) {
    std::operator+((char *)poVar1,in_RDI);
  }
  else {
    std::allocator<char>::allocator();
    local_1ea = 1;
    std::__cxx11::string::string(local_1e8,"",&local_1e9);
  }
  poVar1 = std::operator<<(poVar2,local_1e8);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_1e8);
  if ((local_1ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  }
  std::__cxx11::string::~string(local_1c0);
  if ((local_1c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  this_00 = std::
            __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3386e5);
  std::__cxx11::stringstream::str();
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (this_00,2,local_210,in_RCX);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void connection<config>::log_close_result()
{
    std::stringstream s;

    s << "Disconnect "
      << "close local:[" << m_local_close_code
      << (m_local_close_reason.empty() ? "" : ","+m_local_close_reason)
      << "] remote:[" << m_remote_close_code
      << (m_remote_close_reason.empty() ? "" : ","+m_remote_close_reason) << "]";

    m_alog->write(log::alevel::disconnect,s.str());
}